

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

void CheckBlockDataAvailability(BlockManager *blockman,CBlockIndex *blockindex,bool check_for_undo)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  char *fmt;
  undefined8 uVar4;
  undefined1 in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  uint32_t flag;
  int in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  CBlockIndex *in_stack_ffffffffffffff40;
  BlockManager *in_stack_ffffffffffffff48;
  char **in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff68;
  undefined3 in_stack_ffffffffffffff74;
  uint uVar5;
  int code;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = CONCAT13(in_DL,in_stack_ffffffffffffff74) & 0x1ffffff;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
             (AnnotatedMixin<std::recursive_mutex> *)0x53e4ad);
  uVar3 = 8;
  if ((uVar5 & 0x1000000) != 0) {
    uVar3 = 0x10;
  }
  if ((*(uint *)((long)&in_RSI[2].field_2 + 8) & uVar3) == 0) {
    bVar2 = node::BlockManager::IsBlockPruned(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    if (bVar2) {
      fmt = (char *)__cxa_allocate_exception(0x58);
      code = (int)((ulong)in_RSI >> 0x20);
      tinyformat::format<char_const*>(fmt,in_stack_ffffffffffffff50);
      JSONRPCError(code,in_stack_ffffffffffffff68);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(fmt,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else if ((uVar5 & 0x1000000) == 0) {
      uVar4 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RSI,(char *)CONCAT44(uVar5,uVar3),(allocator<char> *)in_stack_ffffffffffffff68);
      JSONRPCError((int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffff68);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      uVar4 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RSI,(char *)CONCAT44(uVar5,uVar3),(allocator<char> *)in_stack_ffffffffffffff68);
      JSONRPCError((int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffff68);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckBlockDataAvailability(BlockManager& blockman, const CBlockIndex& blockindex, bool check_for_undo)
{
    AssertLockHeld(cs_main);
    uint32_t flag = check_for_undo ? BLOCK_HAVE_UNDO : BLOCK_HAVE_DATA;
    if (!(blockindex.nStatus & flag)) {
        if (blockman.IsBlockPruned(blockindex)) {
            throw JSONRPCError(RPC_MISC_ERROR, strprintf("%s not available (pruned data)", check_for_undo ? "Undo data" : "Block"));
        }
        if (check_for_undo) {
            throw JSONRPCError(RPC_MISC_ERROR, "Undo data not available");
        }
        throw JSONRPCError(RPC_MISC_ERROR, "Block not available (not fully downloaded)");
    }
}